

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O1

string * __thiscall
Diligent::FormatString<char[24],unsigned_long,char[45],unsigned_long,char[75],char[72]>
          (string *__return_storage_ptr__,Diligent *this,char (*Args) [24],unsigned_long *Args_1,
          char (*Args_2) [45],unsigned_long *Args_3,char (*Args_4) [75],char (*Args_5) [72])

{
  stringstream ss;
  stringstream local_1b8 [128];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  FormatStrSS<std::__cxx11::stringstream,char[24],unsigned_long,char[45],unsigned_long,char[75],char[72]>
            ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8,
             (char (*) [24])this,(unsigned_long *)Args,(char (*) [45])Args_1,(unsigned_long *)Args_2
             ,(char (*) [75])Args_3,(char (*) [72])Args_4);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string FormatString(const RestArgsType&... Args)
{
    std::stringstream ss;
    FormatStrSS(ss, Args...);
    return ss.str();
}